

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBuilderCableANCF::BuildBeam
          (ChBuilderCableANCF *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCable> *sect,int N,ChVector<double> *A,
          ChVector<double> *B)

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  *this_00;
  ChMesh *pCVar1;
  pointer psVar2;
  ChElementCableANCF *this_01;
  value_type *__x;
  long lVar3;
  int iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  shared_ptr<chrono::fea::ChElementCableANCF> element;
  ChVector<double> bdir;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeA;
  ChVector<double> pos;
  value_type local_118;
  ChVector<double> local_108;
  shared_ptr<chrono::fea::ChMesh> *local_f0;
  value_type local_e8;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  shared_ptr<chrono::fea::ChElementBase> local_a8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_98;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_88;
  value_type local_78;
  ChVector<double> local_68;
  long local_50;
  double local_48;
  shared_ptr<chrono::fea::ChBeamSectionCable> *local_40;
  ChBuilderCableANCF *local_38;
  
  local_f0 = mesh;
  local_40 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_38 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::clear(this_00);
  local_108.m_data[0] = B->m_data[0] - A->m_data[0];
  local_108.m_data[1] = B->m_data[1] - A->m_data[1];
  local_108.m_data[2] = B->m_data[2] - A->m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_108.m_data[1] * local_108.m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_108.m_data[0];
  auVar6 = vfmadd231sd_fma(auVar6,auVar7,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_108.m_data[2];
  auVar6 = vfmadd231sd_fma(auVar6,auVar8,auVar8);
  if (auVar6._0_8_ < 0.0) {
    dVar5 = sqrt(auVar6._0_8_);
  }
  else {
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar5 = auVar6._0_8_;
  }
  if (dVar5 < 2.2250738585072014e-308) {
    local_108.m_data[0] = 1.0;
    local_108.m_data[1] = 0.0;
    local_108.m_data[2] = 0.0;
  }
  else {
    dVar5 = 1.0 / dVar5;
    local_108.m_data[0] = dVar5 * local_108.m_data[0];
    local_108.m_data[1] = dVar5 * local_108.m_data[1];
    local_108.m_data[2] = dVar5 * local_108.m_data[2];
  }
  local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>const&,chrono::ChVector<double>&>
            (&local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyzD **)&local_78,
             (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_68,A,&local_108);
  pCVar1 = (local_f0->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(pCVar1,&local_88);
  if (local_88.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::push_back(this_00,&local_78);
  if (0 < N) {
    local_48 = (double)N;
    local_50 = (ulong)(uint)N << 4;
    iVar4 = 1;
    lVar3 = 0;
    do {
      dVar5 = (double)iVar4 / local_48;
      local_68.m_data[0] = A->m_data[0] + dVar5 * (B->m_data[0] - A->m_data[0]);
      local_68.m_data[1] = A->m_data[1] + dVar5 * (B->m_data[1] - A->m_data[1]);
      local_68.m_data[2] = A->m_data[2] + dVar5 * (B->m_data[2] - A->m_data[2]);
      local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>&,chrono::ChVector<double>&>
                (&local_e8.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(ChNodeFEAxyzD **)&local_e8,
                 (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_118,&local_68,&local_108);
      pCVar1 = (local_f0->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar1,&local_98);
      if (local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __x = &local_e8;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
      ::push_back(this_00,__x);
      this_01 = (ChElementCableANCF *)
                ChElementCableANCF::operator_new((ChElementCableANCF *)0xa40,(size_t)__x);
      ChElementCableANCF::ChElementCableANCF(this_01);
      local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementCableANCF*>
                (&local_118.
                  super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_01);
      pCVar1 = (local_f0->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_a8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_a8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_118.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_118.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddElement(pCVar1,&local_a8);
      if (local_a8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
      ::push_back(&local_38->beam_elems,&local_118);
      psVar2 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b8 = *(undefined8 *)
                  ((long)&(psVar2->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + lVar3);
      local_b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(psVar2->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          )._M_refcount._M_pi + lVar3);
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_b0->_M_use_count = local_b0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_b0->_M_use_count = local_b0->_M_use_count + 1;
        }
      }
      psVar2 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_c8 = *(undefined8 *)
                  ((long)&psVar2[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + lVar3);
      local_c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&psVar2[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + lVar3);
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
        }
      }
      (*((local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[0x1a])
                (local_118.
                 super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&local_b8,&local_c8);
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      local_d8 = (local_40->
                 super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_d0._M_pi =
           (local_40->
           super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
        }
      }
      ((local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_d8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&((local_118.
                    super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_d0);
      if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
      }
      if (local_118.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.
                   super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar4 = iVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (local_50 != lVar3);
  }
  if (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChBuilderCableANCF::BuildBeam(std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionCable> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   const ChVector<> A,                        // starting point
                                   const ChVector<> B                         // ending point
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChVector<> bdir = (B - A);
    bdir.Normalize();

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzD>(A, bdir);
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzD>(pos, bdir);
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementCableANCF>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        element->SetSection(sect);
    }
}